

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O3

void __thiscall TestMeter::~TestMeter(TestMeter *this)

{
  Meter *pMVar1;
  pointer ppVar2;
  TestMetrics *pTVar3;
  ulong uVar4;
  ulong uVar5;
  
  pMVar1 = this->sourceMeter;
  if (pMVar1 != (Meter *)0x0) {
    std::
    _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(pMVar1->labelMetrics_)._M_h);
    ppVar2 = (pMVar1->metrics_).scoreVsTrue.
             super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (ppVar2 != (pointer)0x0) {
      operator_delete(ppVar2,(long)(pMVar1->metrics_).scoreVsTrue.
                                   super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2
                     );
    }
  }
  operator_delete(pMVar1,0x78);
  pTVar3 = this->metrics;
  if (pTVar3 != (TestMetrics *)0x0) {
    TestMetrics::~TestMetrics(pTVar3);
  }
  operator_delete(pTVar3,0x30);
  uVar4 = this->nlabels;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pTVar3 = this->labelMetrics[uVar5];
      if (pTVar3 != (TestMetrics *)0x0) {
        TestMetrics::~TestMetrics(pTVar3);
        operator_delete(pTVar3,0x30);
        uVar4 = this->nlabels;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  if (this->labelMetrics != (TestMetrics **)0x0) {
    operator_delete__(this->labelMetrics);
    return;
  }
  return;
}

Assistant:

~TestMeter()
    {
        delete sourceMeter;
        delete metrics;

        for (int i = 0; i<nlabels; ++i)
        {
            if (labelMetrics[i] != nullptr)
            {
                delete labelMetrics[i];
            }
        }

        delete[] labelMetrics;
    }